

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb.cc
# Opt level: O0

void CB::parse_label(parser *p,shared_data *param_2,void *v,v_array<substring> *words)

{
  substring s;
  substring ss;
  substring s_00;
  substring s_01;
  substring s_02;
  bool bVar1;
  char *pcVar2;
  substring *psVar3;
  size_t sVar4;
  undefined8 uVar5;
  uint64_t uVar6;
  ostream *poVar7;
  vw_exception *this;
  char *pcVar8;
  string *pmessage;
  ostream *poVar9;
  v_array<substring> *in_RCX;
  long in_RDI;
  stringstream __msg_2;
  stringstream __msg_1;
  stringstream __msg;
  cb_class f;
  size_t i;
  label *ld;
  cb_class *in_stack_fffffffffffff9d8;
  v_array<CB::cb_class> *in_stack_fffffffffffff9e0;
  char *in_stack_fffffffffffff9e8;
  v_array<substring> *in_stack_fffffffffffff9f0;
  string *in_stack_fffffffffffff9f8;
  undefined8 in_stack_fffffffffffffa00;
  int iVar10;
  char *in_stack_fffffffffffffa08;
  vw_exception *in_stack_fffffffffffffa10;
  v_array<substring> *in_stack_fffffffffffffa18;
  undefined8 in_stack_fffffffffffffa20;
  substring *in_stack_fffffffffffffa28;
  ostream *in_stack_fffffffffffffa30;
  char *in_stack_fffffffffffffa50;
  stringstream local_578 [16];
  ostream local_568;
  char *local_3f0;
  char *local_3e8;
  undefined1 local_3d9;
  stringstream local_3b8 [16];
  ostream local_3a8;
  char *local_230;
  char *local_228;
  char *local_220;
  char *local_218;
  undefined1 local_209;
  stringstream local_1d8 [16];
  ostream local_1c8;
  char *local_50;
  char *local_48;
  float local_40;
  undefined4 local_3c;
  float local_38;
  undefined4 local_34;
  char *local_30;
  v_array<substring> *local_20;
  long local_8;
  
  local_30 = (char *)0x0;
  local_20 = in_RCX;
  local_8 = in_RDI;
  while( true ) {
    pcVar8 = local_30;
    pcVar2 = (char *)v_array<substring>::size(local_20);
    if (pcVar2 <= pcVar8) {
      return;
    }
    psVar3 = v_array<substring>::operator[](local_20,(size_t)local_30);
    local_50 = psVar3->begin;
    local_48 = psVar3->end;
    s_00.end = (char *)in_stack_fffffffffffffa30;
    s_00.begin = (char *)in_stack_fffffffffffffa28;
    tokenize<v_array<substring>>
              ((char)((ulong)in_stack_fffffffffffffa20 >> 0x38),s_00,in_stack_fffffffffffffa18,
               SUB81((ulong)in_stack_fffffffffffffa10 >> 0x38,0));
    sVar4 = v_array<substring>::size((v_array<substring> *)(local_8 + 0x310));
    iVar10 = (int)((ulong)in_stack_fffffffffffffa00 >> 0x20);
    if (sVar4 == 0) break;
    sVar4 = v_array<substring>::size((v_array<substring> *)(local_8 + 0x310));
    iVar10 = (int)((ulong)in_stack_fffffffffffffa00 >> 0x20);
    if (3 < sVar4) break;
    local_34 = 0;
    psVar3 = v_array<substring>::operator[]((v_array<substring> *)(local_8 + 0x310),0);
    local_220 = psVar3->begin;
    local_218 = psVar3->end;
    s.end = (char *)in_stack_fffffffffffff9f8;
    s.begin = (char *)in_stack_fffffffffffff9f0;
    uVar6 = hashstring(s,(uint64_t)in_stack_fffffffffffff9e8);
    local_3c = (undefined4)uVar6;
    local_40 = 3.4028235e+38;
    sVar4 = v_array<substring>::size((v_array<substring> *)(local_8 + 0x310));
    if (1 < sVar4) {
      psVar3 = v_array<substring>::operator[]((v_array<substring> *)(local_8 + 0x310),1);
      local_230 = psVar3->begin;
      local_228 = psVar3->end;
      s_01.end = in_stack_fffffffffffffa50;
      s_01.begin = pcVar8;
      local_40 = float_of_substring(s_01);
    }
    bVar1 = nanpattern(0.0);
    iVar10 = (int)((ulong)in_stack_fffffffffffffa00 >> 0x20);
    if (bVar1) {
      std::__cxx11::stringstream::stringstream(local_3b8);
      poVar9 = std::operator<<(&local_3a8,"error NaN cost (");
      psVar3 = v_array<substring>::operator[]((v_array<substring> *)(local_8 + 0x310),1);
      poVar7 = ::operator<<(poVar9,psVar3);
      std::operator<<(poVar7," for action: ");
      this = (vw_exception *)
             v_array<substring>::operator[]((v_array<substring> *)(local_8 + 0x310),0);
      ::operator<<(poVar9,psVar3);
      local_3d9 = 1;
      pcVar8 = (char *)__cxa_allocate_exception(0x38);
      std::__cxx11::stringstream::str();
      VW::vw_exception::vw_exception(this,pcVar8,iVar10,in_stack_fffffffffffff9f8);
      local_3d9 = 0;
      __cxa_throw(pcVar8,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
    local_38 = 0.0;
    sVar4 = v_array<substring>::size((v_array<substring> *)(local_8 + 0x310));
    if (2 < sVar4) {
      psVar3 = v_array<substring>::operator[]((v_array<substring> *)(local_8 + 0x310),2);
      local_3f0 = psVar3->begin;
      local_3e8 = psVar3->end;
      s_02.end = in_stack_fffffffffffffa50;
      s_02.begin = pcVar8;
      local_38 = float_of_substring(s_02);
    }
    bVar1 = nanpattern(0.0);
    if (bVar1) {
      std::__cxx11::stringstream::stringstream(local_578);
      poVar9 = std::operator<<(&local_568,"error NaN probability (");
      iVar10 = (int)((ulong)poVar9 >> 0x20);
      pmessage = (string *)v_array<substring>::operator[]((v_array<substring> *)(local_8 + 0x310),2)
      ;
      poVar9 = ::operator<<(in_stack_fffffffffffffa30,in_stack_fffffffffffffa28);
      std::operator<<(poVar9," for action: ");
      v_array<substring>::operator[]((v_array<substring> *)(local_8 + 0x310),0);
      ::operator<<(in_stack_fffffffffffffa30,in_stack_fffffffffffffa28);
      uVar5 = __cxa_allocate_exception(0x38);
      std::__cxx11::stringstream::str();
      VW::vw_exception::vw_exception
                (in_stack_fffffffffffffa10,in_stack_fffffffffffffa08,iVar10,pmessage);
      __cxa_throw(uVar5,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
    if (1.0 < local_38) {
      poVar9 = std::operator<<((ostream *)&std::cerr,
                               "invalid probability > 1 specified for an action, resetting to 1.");
      std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
      local_38 = 1.0;
    }
    if (local_38 < 0.0) {
      poVar9 = std::operator<<((ostream *)&std::cerr,
                               "invalid probability < 0 specified for an action, resetting to 0.");
      std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
      local_38 = 0.0;
    }
    psVar3 = v_array<substring>::operator[]((v_array<substring> *)(local_8 + 0x310),0);
    in_stack_fffffffffffffa50 = psVar3->begin;
    ss.end = (char *)in_stack_fffffffffffff9f8;
    ss.begin = (char *)in_stack_fffffffffffff9f0;
    bVar1 = substring_eq(ss,in_stack_fffffffffffff9e8);
    if (bVar1) {
      sVar4 = v_array<substring>::size((v_array<substring> *)(local_8 + 0x310));
      if (sVar4 == 1) {
        local_38 = -1.0;
      }
      else {
        poVar9 = std::operator<<((ostream *)&std::cerr,
                                 "shared feature vectors should not have costs");
        std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
      }
    }
    v_array<CB::cb_class>::push_back(in_stack_fffffffffffff9e0,in_stack_fffffffffffff9d8);
    local_30 = local_30 + 1;
  }
  std::__cxx11::stringstream::stringstream(local_1d8);
  std::operator<<(&local_1c8,"malformed cost specification: ");
  ::operator<<((ostream *)in_stack_fffffffffffff9f8,in_stack_fffffffffffff9f0);
  local_209 = 1;
  uVar5 = __cxa_allocate_exception(0x38);
  std::__cxx11::stringstream::str();
  VW::vw_exception::vw_exception
            (in_stack_fffffffffffffa10,in_stack_fffffffffffffa08,iVar10,in_stack_fffffffffffff9f8);
  local_209 = 0;
  __cxa_throw(uVar5,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
}

Assistant:

void parse_label(parser* p, shared_data*, void* v, v_array<substring>& words)
{
  CB::label* ld = (CB::label*)v;
  for (size_t i = 0; i < words.size(); i++)
  {
    cb_class f;
    tokenize(':', words[i], p->parse_name);

    if (p->parse_name.size() < 1 || p->parse_name.size() > 3)
      THROW("malformed cost specification: " << p->parse_name);

    f.partial_prediction = 0.;
    f.action = (uint32_t)hashstring(p->parse_name[0], 0);
    f.cost = FLT_MAX;

    if (p->parse_name.size() > 1)
      f.cost = float_of_substring(p->parse_name[1]);

    if (nanpattern(f.cost))
      THROW("error NaN cost (" << p->parse_name[1] << " for action: " << p->parse_name[0]);

    f.probability = .0;
    if (p->parse_name.size() > 2)
      f.probability = float_of_substring(p->parse_name[2]);

    if (nanpattern(f.probability))
      THROW("error NaN probability (" << p->parse_name[2] << " for action: " << p->parse_name[0]);

    if (f.probability > 1.0)
    {
      cerr << "invalid probability > 1 specified for an action, resetting to 1." << endl;
      f.probability = 1.0;
    }
    if (f.probability < 0.0)
    {
      cerr << "invalid probability < 0 specified for an action, resetting to 0." << endl;
      f.probability = .0;
    }
    if (substring_eq(p->parse_name[0], "shared"))
    {
      if (p->parse_name.size() == 1)
      {
        f.probability = -1.f;
      }
      else
        cerr << "shared feature vectors should not have costs" << endl;
    }

    ld->costs.push_back(f);
  }
}